

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

module __thiscall pybind11::module::import(module *this,char *name)

{
  error_already_set *this_00;
  handle local_38 [3];
  PyObject *local_20;
  PyObject *obj;
  char *name_local;
  
  obj = (PyObject *)name;
  name_local = (char *)this;
  local_20 = (PyObject *)PyImport_ImportModule(name);
  if (local_20 == (PyObject *)0x0) {
    this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this_00);
    __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  handle::handle(local_38,local_20);
  reinterpret_steal<pybind11::module>((pybind11 *)this,local_38[0]);
  return (object)(object)this;
}

Assistant:

static module import(const char *name) {
        PyObject *obj = PyImport_ImportModule(name);
        if (!obj)
            throw error_already_set();
        return reinterpret_steal<module>(obj);
    }